

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImmutableList.cpp
# Opt level: O3

void __thiscall
regex::ImmutableStringBuilder<8>::AppendWithCopy(ImmutableStringBuilder<8> *this,LPCWSTR str)

{
  size_t _SizeInWords;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  HeapAllocator *pHVar5;
  WCHAR *_Dst;
  char *pcVar6;
  size_t byteSize;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (str == (LPCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
                       ,0x32,"(str != nullptr)","str != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sVar4 = PAL_wcslen(str);
  _SizeInWords = sVar4 + 1;
  local_58 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_269edfc;
  data.filename._0_4_ = 0x35;
  data.plusSize = _SizeInWords;
  pHVar5 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  byteSize = 0xffffffffffffffff;
  if (-1 < (long)_SizeInWords) {
    byteSize = sVar4 * 2 + 2;
  }
  _Dst = (WCHAR *)Memory::HeapAllocator::AllocT<true>(pHVar5,byteSize);
  if (_Dst != (WCHAR *)0x0) {
    wcsncpy_s(_Dst,_SizeInWords,str,_SizeInWords);
    local_58 = (undefined1  [8])&AllocatedStringChunk::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_269edfc;
    data.filename._0_4_ = 0x3a;
    pHVar5 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    pcVar6 = Memory::HeapAllocator::AllocT<true>(pHVar5,0x10);
    *(WCHAR **)pcVar6 = _Dst;
    *(undefined8 *)(pcVar6 + 8) = *(undefined8 *)(this + 0x20);
    *(char **)(this + 0x20) = pcVar6;
    Append(this,_Dst);
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void regex::ImmutableStringBuilder<chunkSize>::AppendWithCopy(_In_z_ LPCWSTR str)
{
    AssertMsg(str != nullptr, "str != nullptr");
    size_t strLength = wcslen(str) + 1; // include null-terminated

    WCHAR* buffer = HeapNewNoThrowArray(WCHAR, strLength);
    IfNullThrowOutOfMemory(buffer);
    wcsncpy_s(buffer, strLength, str, strLength);

    // append in front of the tracked allocated strings
    AllocatedStringChunk* newAllocatedString = HeapNewNoThrow(AllocatedStringChunk);
    if (newAllocatedString == nullptr)
    {
        // cleanup
        HeapDeleteArray(strLength, buffer);
        Js::Throw::OutOfMemory();
    }

    newAllocatedString->dataPtr = buffer;
    newAllocatedString->next = this->allocatedStringChunksHead;
    this->allocatedStringChunksHead = newAllocatedString;

    // append to the stringBuilder string
    this->Append(buffer);
}